

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbiw__zlib_flushf(uchar *data,uint *bitbuffer,int *bitcount)

{
  uint uVar1;
  int iVar2;
  uint itemsize;
  int *piVar3;
  uchar *data_local;
  
  iVar2 = *bitcount;
  piVar3 = bitcount;
  data_local = data;
  do {
    itemsize = (uint)piVar3;
    if (iVar2 < 8) {
      return data;
    }
    if (data == (uchar *)0x0) {
LAB_0017ffab:
      stbiw__sbgrowf(&data_local,1,itemsize);
      iVar2 = *(int *)(data_local + -4);
      itemsize = iVar2 + 1;
      data = data_local;
    }
    else {
      iVar2 = *(int *)(data + -4);
      itemsize = iVar2 + 1;
      if (*(int *)(data + -8) <= (int)itemsize) goto LAB_0017ffab;
    }
    piVar3 = (int *)(ulong)itemsize;
    uVar1 = *bitbuffer;
    *(uint *)(data + -4) = itemsize;
    data[iVar2] = (uchar)uVar1;
    *bitbuffer = *bitbuffer >> 8;
    iVar2 = *bitcount + -8;
    *bitcount = iVar2;
  } while( true );
}

Assistant:

static unsigned char *stbiw__zlib_flushf(unsigned char *data, unsigned int *bitbuffer, int *bitcount)
{
   while (*bitcount >= 8) {
      stbiw__sbpush(data, STBIW_UCHAR(*bitbuffer));
      *bitbuffer >>= 8;
      *bitcount -= 8;
   }
   return data;
}